

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::ImageFeatureType_ImageSize::_InternalParse
          (ImageFeatureType_ImageSize *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  uint uVar4;
  pair<const_char_*,_unsigned_int> pVar5;
  pair<const_char_*,_unsigned_long> pVar6;
  byte *local_30;
  
  local_30 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_30;
      uVar4 = (uint)bVar1;
      p = local_30 + 1;
      if ((char)bVar1 < '\0') {
        uVar4 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar5 = google::protobuf::internal::ReadTagFallback((char *)local_30,uVar4);
          p = (byte *)pVar5.first;
          uVar4 = pVar5.second;
        }
        else {
          p = local_30 + 2;
        }
      }
      local_30 = p;
      if (uVar4 >> 3 == 2) {
        if ((char)uVar4 != '\x10') goto LAB_001f3d4b;
        uVar3 = (ulong)(char)*p;
        local_30 = p + 1;
        if ((long)uVar3 < 0) {
          uVar4 = ((uint)*local_30 * 0x80 + (uint)*p) - 0x80;
          if ((char)*local_30 < '\0') {
            local_30 = p;
            pVar6 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar4);
            local_30 = (byte *)pVar6.first;
            this->height_ = pVar6.second;
            goto LAB_001f3d83;
          }
          uVar3 = (ulong)uVar4;
          local_30 = p + 2;
        }
        this->height_ = uVar3;
      }
      else if ((uVar4 >> 3 == 1) && ((char)uVar4 == '\b')) {
        uVar3 = (ulong)(char)*p;
        local_30 = p + 1;
        if ((long)uVar3 < 0) {
          uVar4 = ((uint)*local_30 * 0x80 + (uint)*p) - 0x80;
          if ((char)*local_30 < '\0') {
            local_30 = p;
            pVar6 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar4);
            local_30 = (byte *)pVar6.first;
            this->width_ = pVar6.second;
            goto LAB_001f3d83;
          }
          uVar3 = (ulong)uVar4;
          local_30 = p + 2;
        }
        this->width_ = uVar3;
      }
      else {
LAB_001f3d4b:
        if ((uVar4 == 0) || ((uVar4 & 7) == 4)) {
          if (p == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar4 - 1;
          return (char *)p;
        }
        uVar3 = this_00->ptr_;
        if ((uVar3 & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar3 & 0xfffffffffffffffc) + 8);
        }
        local_30 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (uVar4,unknown,(char *)local_30,ctx);
LAB_001f3d83:
        if (local_30 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_30;
}

Assistant:

const char* ImageFeatureType_ImageSize::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint64 width = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          width_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // uint64 height = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          height_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}